

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klvwalk.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  IFileReader *pIVar5;
  undefined8 uVar6;
  Dictionary *pDVar7;
  reference pbVar8;
  size_type sVar9;
  ILogSink *pIVar10;
  reference pPVar11;
  pointer pPVar12;
  char *pcVar13;
  bool local_12ad;
  IFileReader local_12a0 [104];
  IFileReader local_1238 [111];
  allocator<char> local_11c9;
  string local_11c8 [32];
  Result_t local_11a8 [104];
  int64_t local_1140;
  ui64_t pos;
  KLVFilePacket KP;
  IFileReader local_10c8 [104];
  undefined1 local_1060 [8];
  Partition plain_part;
  _IO_lock_t *local_fd8;
  Result_t local_f38 [104];
  iterator local_ed0;
  _List_const_iterator<ASDCP::MXF::RIP::PartitionPair> local_ec8;
  iterator local_ec0;
  _List_const_iterator<ASDCP::MXF::RIP::PartitionPair> local_eb8;
  _List_const_iterator<ASDCP::MXF::RIP::PartitionPair> local_eb0;
  const_pair_iterator i;
  IFileReader local_e38 [4];
  ui32_t test_s_1;
  IFileReader local_dd0 [111];
  allocator<char> local_d61;
  string local_d60 [32];
  Result_t local_d40 [104];
  undefined1 local_cd8 [8];
  RIP RIP_1;
  list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_> local_c58;
  OP1aHeader local_c40 [8];
  OP1aHeader Header_1;
  Dictionary *Dict_1;
  Result_t local_9b8 [104];
  undefined1 local_950 [8];
  OPAtomIndexFooter Index;
  IFileReader local_7c0 [104];
  undefined1 local_758 [8];
  Partition TmpPart;
  int local_698;
  Result_t local_630 [104];
  iterator local_5c8;
  _List_const_iterator<ASDCP::MXF::RIP::PartitionPair> local_5c0;
  _List_node_base *local_5b8;
  iterator local_5b0;
  _List_const_iterator<ASDCP::MXF::RIP::PartitionPair> local_5a8;
  const_pair_iterator pi;
  Result_t local_538 [108];
  undefined4 local_4cc;
  IFileReader local_4c8 [4];
  ui32_t test_s;
  IFileReader local_460 [104];
  Result_t local_3f8 [104];
  undefined1 local_390 [8];
  RIP RIP;
  list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_> local_310;
  undefined1 local_2f8 [8];
  OP1aHeader Header;
  void *local_260;
  Dictionary *Dict;
  mem_ptr<Kumu::IFileReader> Reader;
  FileReaderFactory local_c0 [8];
  FileReaderFactory defaultFactory;
  Result_t result;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  iterator fi;
  undefined1 local_38 [8];
  CommandOptions Options;
  char **argv_local;
  int argc_local;
  
  Options.inFileList.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)argv;
  CommandOptions::CommandOptions((CommandOptions *)local_38,argc,argv);
  if ((local_38[1] & 1U) != 0) {
    banner((FILE *)_stdout);
  }
  if ((local_38[2] & 1U) != 0) {
    usage((FILE *)_stdout);
  }
  if (((local_38[1] & 1U) == 0) && ((local_38[2] & 1U) == 0)) {
    if ((local_38[0] & 1U) == 0) {
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_List_iterator(&local_50);
      Kumu::Result_t::Result_t((Result_t *)&defaultFactory,(Result_t *)Kumu::RESULT_OK);
      Kumu::FileReaderFactory::FileReaderFactory(local_c0);
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&Options);
      while( true ) {
        iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
        local_12ad = false;
        if (-1 < iVar4) {
          Reader.m_p = (IFileReader *)
                       std::__cxx11::
                       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&Options);
          local_12ad = std::operator!=(&local_50,(_Self *)&Reader);
        }
        if (local_12ad == false) break;
        pIVar5 = (IFileReader *)Kumu::FileReaderFactory::CreateFileReader();
        ASDCP::mem_ptr<Kumu::IFileReader>::mem_ptr((mem_ptr<Kumu::IFileReader> *)&Dict,pIVar5);
        pFVar1 = _stderr;
        if ((local_38[3] & 1U) != 0) {
          std::
          _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&local_50);
          uVar6 = std::__cxx11::string::c_str();
          fprintf(pFVar1,"Opening file %s\n",uVar6);
        }
        if ((local_38[4] & 1U) == 0) {
          if ((local_38[5] & 1U) == 0) {
            ASDCP::KLVFilePacket::KLVFilePacket((KLVFilePacket *)&pos);
            local_1140 = 0;
            pIVar5 = ASDCP::mem_ptr<Kumu::IFileReader>::operator->
                               ((mem_ptr<Kumu::IFileReader> *)&Dict);
            std::
            _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_50);
            pcVar13 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_11c8,pcVar13,&local_11c9);
            (**(code **)(*(long *)pIVar5 + 0x10))(local_11a8,pIVar5,local_11c8);
            Kumu::Result_t::operator=((Result_t *)&defaultFactory,local_11a8);
            Kumu::Result_t::~Result_t(local_11a8);
            std::__cxx11::string::~string(local_11c8);
            std::allocator<char>::~allocator(&local_11c9);
            iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
            if (-1 < iVar4) {
              ASDCP::mem_ptr<Kumu::IFileReader>::operator*((mem_ptr<Kumu::IFileReader> *)&Dict);
              ASDCP::KLVFilePacket::InitFromFile(local_1238);
              Kumu::Result_t::operator=((Result_t *)&defaultFactory,(Result_t *)local_1238);
              Kumu::Result_t::~Result_t((Result_t *)local_1238);
            }
            while (iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory),
                  -1 < iVar4) {
              fprintf(_stdout,"@0x%08llx: ",local_1140);
              pFVar1 = _stdout;
              bVar3 = (bool)ASDCP::DefaultCompositeDict();
              ASDCP::KLVPacket::Dump((_IO_FILE *)&pos,(Dictionary *)pFVar1,bVar3);
              pIVar5 = ASDCP::mem_ptr<Kumu::IFileReader>::operator->
                                 ((mem_ptr<Kumu::IFileReader> *)&Dict);
              local_1140 = Kumu::IFileReader::TellPosition(pIVar5);
              ASDCP::mem_ptr<Kumu::IFileReader>::operator*((mem_ptr<Kumu::IFileReader> *)&Dict);
              ASDCP::KLVFilePacket::InitFromFile(local_12a0);
              Kumu::Result_t::operator=((Result_t *)&defaultFactory,(Result_t *)local_12a0);
              Kumu::Result_t::~Result_t((Result_t *)local_12a0);
              bVar3 = Kumu::Result_t::operator==
                                ((Result_t *)&defaultFactory,(Result_t *)Kumu::RESULT_ALLOC);
              if ((bVar3) && ((local_38[6] & 1U) != 0)) {
                fprintf(_stdout,"Skipping huge packet, reporting zero packet size.\n");
                Kumu::Result_t::operator=((Result_t *)&defaultFactory,(Result_t *)Kumu::RESULT_OK);
              }
            }
            bVar3 = Kumu::Result_t::operator==
                              ((Result_t *)&defaultFactory,(Result_t *)Kumu::RESULT_ENDOFFILE);
            if (bVar3) {
              Kumu::Result_t::operator=((Result_t *)&defaultFactory,(Result_t *)Kumu::RESULT_OK);
            }
            ASDCP::KLVFilePacket::~KLVFilePacket((KLVFilePacket *)&pos);
          }
          else {
            pDVar7 = (Dictionary *)ASDCP::DefaultCompositeDict();
            ASDCP::MXF::OP1aHeader::OP1aHeader(local_c40,pDVar7);
            ASDCP::MXF::RIP::RIP((RIP *)local_cd8,pDVar7);
            pIVar5 = ASDCP::mem_ptr<Kumu::IFileReader>::operator->
                               ((mem_ptr<Kumu::IFileReader> *)&Dict);
            std::
            _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_50);
            pcVar13 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_d60,pcVar13,&local_d61);
            (**(code **)(*(long *)pIVar5 + 0x10))(local_d40,pIVar5,local_d60);
            Kumu::Result_t::operator=((Result_t *)&defaultFactory,local_d40);
            Kumu::Result_t::~Result_t(local_d40);
            std::__cxx11::string::~string(local_d60);
            std::allocator<char>::~allocator(&local_d61);
            iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
            if (-1 < iVar4) {
              ASDCP::mem_ptr<Kumu::IFileReader>::operator*((mem_ptr<Kumu::IFileReader> *)&Dict);
              ASDCP::MXF::SeekToRIP(local_dd0);
              Kumu::Result_t::operator=((Result_t *)&defaultFactory,(Result_t *)local_dd0);
              Kumu::Result_t::~Result_t((Result_t *)local_dd0);
            }
            iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
            if (iVar4 < 0) {
              pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
              pcVar13 = Kumu::Result_t::Label((Result_t *)&defaultFactory);
              Kumu::ILogSink::Error(pIVar10,"walk_parts SeekToRIP failed: %s\n",pcVar13);
            }
            else {
              ASDCP::mem_ptr<Kumu::IFileReader>::operator*((mem_ptr<Kumu::IFileReader> *)&Dict);
              ASDCP::MXF::RIP::InitFromFile(local_e38);
              Kumu::Result_t::operator=((Result_t *)&defaultFactory,(Result_t *)local_e38);
              Kumu::Result_t::~Result_t((Result_t *)local_e38);
              std::__cxx11::
              list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
              ::size(&local_c58);
              iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
              if (iVar4 < 0) {
                pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
                Kumu::ILogSink::Error(pIVar10,"File contains no RIP\n");
                Kumu::Result_t::operator=((Result_t *)&defaultFactory,(Result_t *)Kumu::RESULT_OK);
              }
              else {
                bVar3 = std::__cxx11::
                        list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                        ::empty(&local_c58);
                if (bVar3) {
                  pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
                  Kumu::ILogSink::Error(pIVar10,"RIP contains no Pairs.\n");
                }
              }
              pIVar5 = ASDCP::mem_ptr<Kumu::IFileReader>::operator->
                                 ((mem_ptr<Kumu::IFileReader> *)&Dict);
              (**(code **)(*(long *)pIVar5 + 0x28))(&i,pIVar5,0);
              Kumu::Result_t::~Result_t((Result_t *)&i);
            }
            iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
            if (-1 < iVar4) {
              ASDCP::MXF::RIP::Dump((_IO_FILE *)local_cd8);
              std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::_List_const_iterator
                        (&local_eb0);
              local_ec0._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                   ::begin(&local_c58);
              std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::_List_const_iterator
                        (&local_eb8,&local_ec0);
              local_eb0._M_node = local_eb8._M_node;
              while( true ) {
                local_ed0._M_node =
                     (_List_node_base *)
                     std::__cxx11::
                     list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                     ::end(&local_c58);
                std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::_List_const_iterator
                          (&local_ec8,&local_ed0);
                bVar3 = std::operator!=(&local_eb0,&local_ec8);
                if (!bVar3) break;
                pIVar5 = ASDCP::mem_ptr<Kumu::IFileReader>::operator->
                                   ((mem_ptr<Kumu::IFileReader> *)&Dict);
                pPVar12 = std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator->
                                    (&local_eb0);
                (**(code **)(*(long *)pIVar5 + 0x28))(local_f38,pIVar5,pPVar12->ByteOffset,0);
                Kumu::Result_t::~Result_t(local_f38);
                ASDCP::MXF::Partition::Partition((Partition *)local_1060,pDVar7);
                ASDCP::mem_ptr<Kumu::IFileReader>::operator*((mem_ptr<Kumu::IFileReader> *)&Dict);
                ASDCP::MXF::Partition::InitFromFile(local_10c8);
                Kumu::Result_t::~Result_t((Result_t *)local_10c8);
                pPVar12 = std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator->
                                    (&local_eb0);
                if (local_fd8 != (_IO_lock_t *)pPVar12->ByteOffset) {
                  pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
                  std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator->(&local_eb0);
                  Kumu::ILogSink::Error
                            (pIVar10,"ThisPartition value error: wanted=%qu, got=%qu\n",local_fd8);
                }
                ASDCP::MXF::Partition::Dump((_IO_FILE *)local_1060);
                ASDCP::MXF::Partition::~Partition((Partition *)local_1060);
                std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator++(&local_eb0);
              }
            }
            ASDCP::MXF::RIP::~RIP((RIP *)local_cd8);
            ASDCP::MXF::OP1aHeader::~OP1aHeader(local_c40);
          }
        }
        else {
          pDVar7 = (Dictionary *)ASDCP::DefaultCompositeDict();
          ASDCP::MXF::OP1aHeader::OP1aHeader((OP1aHeader *)local_2f8,pDVar7);
          ASDCP::MXF::RIP::RIP((RIP *)local_390,pDVar7);
          pIVar5 = ASDCP::mem_ptr<Kumu::IFileReader>::operator->
                             ((mem_ptr<Kumu::IFileReader> *)&Dict);
          pbVar8 = std::
                   _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_50);
          (**(code **)(*(long *)pIVar5 + 0x10))(local_3f8,pIVar5,pbVar8);
          Kumu::Result_t::operator=((Result_t *)&defaultFactory,local_3f8);
          Kumu::Result_t::~Result_t(local_3f8);
          iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
          if (-1 < iVar4) {
            ASDCP::mem_ptr<Kumu::IFileReader>::operator*((mem_ptr<Kumu::IFileReader> *)&Dict);
            ASDCP::MXF::SeekToRIP(local_460);
            Kumu::Result_t::operator=((Result_t *)&defaultFactory,(Result_t *)local_460);
            Kumu::Result_t::~Result_t((Result_t *)local_460);
            iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
            if (iVar4 < 0) {
              pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
              pcVar13 = Kumu::Result_t::Label((Result_t *)&defaultFactory);
              Kumu::ILogSink::Error(pIVar10,"read_mxf SeekToRIP failed: %s\n",pcVar13);
            }
            else {
              ASDCP::mem_ptr<Kumu::IFileReader>::operator*((mem_ptr<Kumu::IFileReader> *)&Dict);
              ASDCP::MXF::RIP::InitFromFile(local_4c8);
              Kumu::Result_t::operator=((Result_t *)&defaultFactory,(Result_t *)local_4c8);
              Kumu::Result_t::~Result_t((Result_t *)local_4c8);
              sVar9 = std::__cxx11::
                      list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                      ::size(&local_310);
              local_4cc = (undefined4)sVar9;
              iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
              if (iVar4 < 0) {
                pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
                Kumu::ILogSink::Error(pIVar10,"File contains no RIP\n");
                Kumu::Result_t::operator=((Result_t *)&defaultFactory,(Result_t *)Kumu::RESULT_OK);
              }
              else {
                bVar3 = std::__cxx11::
                        list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                        ::empty(&local_310);
                if (bVar3) {
                  pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
                  Kumu::ILogSink::Error(pIVar10,"RIP contains no Pairs.\n");
                }
              }
              pIVar5 = ASDCP::mem_ptr<Kumu::IFileReader>::operator->
                                 ((mem_ptr<Kumu::IFileReader> *)&Dict);
              (**(code **)(*(long *)pIVar5 + 0x28))(local_538,pIVar5,0);
              Kumu::Result_t::~Result_t(local_538);
            }
          }
          iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
          if (-1 < iVar4) {
            ASDCP::mem_ptr<Kumu::IFileReader>::operator*((mem_ptr<Kumu::IFileReader> *)&Dict);
            ASDCP::MXF::OP1aHeader::InitFromFile((IFileReader *)&pi);
            Kumu::Result_t::operator=((Result_t *)&defaultFactory,(Result_t *)&pi);
            Kumu::Result_t::~Result_t((Result_t *)&pi);
          }
          iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
          if (-1 < iVar4) {
            ASDCP::MXF::OP1aHeader::Dump((_IO_FILE *)local_2f8);
          }
          iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
          if ((-1 < iVar4) &&
             (sVar9 = std::__cxx11::
                      list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                      ::size(&local_310), 2 < sVar9)) {
            local_5b0._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                 ::begin(&local_310);
            std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::_List_const_iterator
                      (&local_5a8,&local_5b0);
            local_5b8 = (_List_node_base *)
                        std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator++
                                  (&local_5a8,0);
            while( true ) {
              local_5c8._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                   ::end(&local_310);
              std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::_List_const_iterator
                        (&local_5c0,&local_5c8);
              bVar2 = std::operator!=(&local_5a8,&local_5c0);
              bVar3 = false;
              if (bVar2) {
                iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
                bVar3 = -1 < iVar4;
              }
              if (!bVar3) break;
              pIVar5 = ASDCP::mem_ptr<Kumu::IFileReader>::operator->
                                 ((mem_ptr<Kumu::IFileReader> *)&Dict);
              pPVar11 = std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator*
                                  (&local_5a8);
              (**(code **)(*(long *)pIVar5 + 0x28))(local_630,pIVar5,pPVar11->ByteOffset);
              Kumu::Result_t::operator=((Result_t *)&defaultFactory,local_630);
              Kumu::Result_t::~Result_t(local_630);
              iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
              if (-1 < iVar4) {
                ASDCP::MXF::Partition::Partition((Partition *)local_758,pDVar7);
                ASDCP::mem_ptr<Kumu::IFileReader>::operator*((mem_ptr<Kumu::IFileReader> *)&Dict);
                ASDCP::MXF::Partition::InitFromFile(local_7c0);
                Kumu::Result_t::operator=((Result_t *)&defaultFactory,(Result_t *)local_7c0);
                Kumu::Result_t::~Result_t((Result_t *)local_7c0);
                iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
                if ((-1 < iVar4) && (local_698 != 0)) {
                  ASDCP::MXF::Partition::Dump((_IO_FILE *)local_758);
                }
                ASDCP::MXF::Partition::~Partition((Partition *)local_758);
              }
              std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator++(&local_5a8,0);
            }
          }
          iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
          if (-1 < iVar4) {
            ASDCP::MXF::OPAtomIndexFooter::OPAtomIndexFooter((OPAtomIndexFooter *)local_950,pDVar7);
            pIVar5 = ASDCP::mem_ptr<Kumu::IFileReader>::operator->
                               ((mem_ptr<Kumu::IFileReader> *)&Dict);
            (**(code **)(*(long *)pIVar5 + 0x28))(local_9b8,pIVar5,local_260);
            Kumu::Result_t::operator=((Result_t *)&defaultFactory,local_9b8);
            Kumu::Result_t::~Result_t(local_9b8);
            iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
            if (-1 < iVar4) {
              ASDCP::mem_ptr<Kumu::IFileReader>::operator*((mem_ptr<Kumu::IFileReader> *)&Dict);
              ASDCP::MXF::OPAtomIndexFooter::InitFromFile((IFileReader *)&Dict_1);
              Kumu::Result_t::operator=((Result_t *)&defaultFactory,(Result_t *)&Dict_1);
              Kumu::Result_t::~Result_t((Result_t *)&Dict_1);
            }
            iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
            if (-1 < iVar4) {
              ASDCP::MXF::OPAtomIndexFooter::Dump((_IO_FILE *)local_950);
            }
            ASDCP::MXF::OPAtomIndexFooter::~OPAtomIndexFooter((OPAtomIndexFooter *)local_950);
          }
          iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
          if (-1 < iVar4) {
            ASDCP::MXF::RIP::Dump((_IO_FILE *)local_390);
          }
          ASDCP::MXF::RIP::~RIP((RIP *)local_390);
          ASDCP::MXF::OP1aHeader::~OP1aHeader((OP1aHeader *)local_2f8);
        }
        ASDCP::mem_ptr<Kumu::IFileReader>::~mem_ptr((mem_ptr<Kumu::IFileReader> *)&Dict);
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_50,0);
      }
      iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)&defaultFactory);
      if (iVar4 < 0) {
        fputs("Program stopped on error.\n",_stderr);
        bVar3 = Kumu::Result_t::operator!=
                          ((Result_t *)&defaultFactory,(Result_t *)Kumu::RESULT_FAIL);
        if (bVar3) {
          pcVar13 = Kumu::Result_t::operator_cast_to_char_((Result_t *)&defaultFactory);
          fputs(pcVar13,_stderr);
          fputc(10,_stderr);
        }
        argv_local._4_4_ = 1;
      }
      else {
        argv_local._4_4_ = 0;
      }
      fi._M_node._0_4_ = 1;
      Kumu::FileReaderFactory::~FileReaderFactory(local_c0);
      Kumu::Result_t::~Result_t((Result_t *)&defaultFactory);
    }
    else {
      fprintf(_stderr,"There was a problem. Type %s -h for help.\n",PROGRAM_NAME);
      argv_local._4_4_ = 3;
      fi._M_node._0_4_ = 1;
    }
  }
  else {
    argv_local._4_4_ = 0;
    fi._M_node._0_4_ = 1;
  }
  CommandOptions::~CommandOptions((CommandOptions *)local_38);
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, const char** argv)
{
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  FileList_t::iterator fi;
  Result_t result = RESULT_OK;
  Kumu::FileReaderFactory defaultFactory;

  for ( fi = Options.inFileList.begin(); ASDCP_SUCCESS(result) && fi != Options.inFileList.end(); fi++ )
    {
      ASDCP::mem_ptr<Kumu::IFileReader> Reader(defaultFactory.CreateFileReader());
      if (Options.verbose_flag)
	fprintf(stderr, "Opening file %s\n", ((*fi).c_str()));
      
      if ( Options.read_mxf_flag ) // dump MXF
	{      
	  const Dictionary* Dict = &DefaultCompositeDict();
	  ASDCP::MXF::OP1aHeader Header(Dict);
	  ASDCP::MXF::RIP RIP(Dict);
	  
	  result = Reader->OpenRead(*fi);
	  
	  if ( ASDCP_SUCCESS(result) )
	    {
		  result = MXF::SeekToRIP(*Reader);
	      
	      if ( ASDCP_SUCCESS(result) )
		{
		  result = RIP.InitFromFile(*Reader);
		  ui32_t test_s = RIP.PairArray.size();

		  if ( ASDCP_FAILURE(result) )
		    {
		      DefaultLogSink().Error("File contains no RIP\n");
		      result = RESULT_OK;
		    }
		  else if ( RIP.PairArray.empty() )
		    {
		      DefaultLogSink().Error("RIP contains no Pairs.\n");
		    }

		  Reader->Seek(0);
		}
	      else
		{
		  DefaultLogSink().Error("read_mxf SeekToRIP failed: %s\n", result.Label());
		}
	    }

	  if ( ASDCP_SUCCESS(result) )
        result = Header.InitFromFile(*Reader);
	  
	  if ( ASDCP_SUCCESS(result) )
	    Header.Dump(stdout);
	  
	  if ( ASDCP_SUCCESS(result) && RIP.PairArray.size() > 2 )
	    {
	      MXF::RIP::const_pair_iterator pi = RIP.PairArray.begin();

	      for ( pi++; pi != RIP.PairArray.end() && ASDCP_SUCCESS(result); pi++ )
		{
		  result = Reader->Seek((*pi).ByteOffset);

		  if ( ASDCP_SUCCESS(result) )
		    {
		      MXF::Partition TmpPart(Dict);
              result = TmpPart.InitFromFile(*Reader);

		      if ( ASDCP_SUCCESS(result) && TmpPart.BodySID > 0 )
			TmpPart.Dump(stdout);
		    }
		}
	    }

	  if ( ASDCP_SUCCESS(result) )
	    {
	      ASDCP::MXF::OPAtomIndexFooter Index(Dict);
	      result = Reader->Seek(Header.FooterPartition);
	      
	      if ( ASDCP_SUCCESS(result) )
		{
		  Index.m_Lookup = &Header.m_Primer;
          result = Index.InitFromFile(*Reader);
		}
	      
	      if ( ASDCP_SUCCESS(result) )
		Index.Dump(stdout);
	    }

	  if ( ASDCP_SUCCESS(result) )
	    RIP.Dump(stdout);
	}
      else if ( Options.walk_parts_flag )
	{
	  const Dictionary* Dict = &DefaultCompositeDict();
	  ASDCP::MXF::OP1aHeader Header(Dict);
	  ASDCP::MXF::RIP RIP(Dict);
	  
	  result = Reader->OpenRead((*fi).c_str());
	  
	  if ( ASDCP_SUCCESS(result) )
        result = MXF::SeekToRIP(*Reader);

	  if ( ASDCP_SUCCESS(result) )
	    {
          result = RIP.InitFromFile(*Reader);
	      ui32_t test_s = RIP.PairArray.size();

	      if ( ASDCP_FAILURE(result) )
		{
		  DefaultLogSink().Error("File contains no RIP\n");
		  result = RESULT_OK;
		}
	      else if ( RIP.PairArray.empty() )
		{
		  DefaultLogSink().Error("RIP contains no Pairs.\n");
		}

	      Reader->Seek(0);
	    }
	  else
	    {
	      DefaultLogSink().Error("walk_parts SeekToRIP failed: %s\n", result.Label());
	    }

	  if ( ASDCP_SUCCESS(result) )
	    {
	      RIP.Dump();

	      MXF::RIP::const_pair_iterator i;
	      for ( i = RIP.PairArray.begin(); i != RIP.PairArray.end(); ++i )
		{
		  Reader->Seek(i->ByteOffset);
		  MXF::Partition plain_part(Dict);
          plain_part.InitFromFile(*Reader);

		  if ( plain_part.ThisPartition != i->ByteOffset )
		    {
		      DefaultLogSink().Error("ThisPartition value error: wanted=%qu, got=%qu\n",
					     plain_part.ThisPartition, i->ByteOffset);
		    }

		  plain_part.Dump();
		}
	    }
	}
      else // dump klv
	{      
	  KLVFilePacket KP;
	  ui64_t pos = 0;

	  result = Reader->OpenRead((*fi).c_str());
	  
	  if ( ASDCP_SUCCESS(result) )
	    result = KP.InitFromFile(*Reader);
	  
	  while ( ASDCP_SUCCESS(result) )
	    {
	      fprintf(stdout, "@0x%08llx: ", pos);
	      KP.Dump(stdout, DefaultCompositeDict(), true);
	      pos = Reader->TellPosition();
	      result = KP.InitFromFile(*Reader);

              if ( result == RESULT_ALLOC && Options.allow_skip_flag )
                {
                  fprintf(stdout, "Skipping huge packet, reporting zero packet size.\n");
                  result = RESULT_OK;
                }
            }
	  
	  if( result == RESULT_ENDOFFILE )
	    result = RESULT_OK;
	}
    }

  if ( ASDCP_FAILURE(result) )
    {
      fputs("Program stopped on error.\n", stderr);
      
      if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}
      
      return 1;
    }
  
  return 0;
}